

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::UniversalPrintArray<char_volatile>(char *begin,size_t N,iu_ostream *os)

{
  char *pcVar1;
  
  if (N == 0) {
    pcVar1 = "{}";
  }
  else {
    std::operator<<(os,"{ ");
    if (0x12 < N) {
      PrintRawArrayTo<char_volatile>(begin,9,os);
      std::operator<<(os,", ..., ");
      begin = begin + (N - 9);
      N = 9;
    }
    PrintRawArrayTo<char_volatile>(begin,N,os);
    pcVar1 = " }";
  }
  std::operator<<(os,pcVar1);
  return;
}

Assistant:

inline void IUTEST_ATTRIBUTE_UNUSED_ UniversalPrintArray(const T* begin, size_t N, iu_ostream* os)
{
    if( N == 0 )
    {
        *os << "{}";
    }
    else
    {
        *os << "{ ";
        const size_t kThreshold = kValues::PrintArrayThreshold;
        const size_t kChunksize = kValues::PrintArrayChunksize;
        if( N <= kThreshold )
        {
            PrintRawArrayTo(begin, N, os);
        }
        else
        {
            PrintRawArrayTo(begin, kChunksize, os);
            *os << ", ..., ";
            PrintRawArrayTo(begin + N - kChunksize, kChunksize, os);
        }
        *os << " }";
    }
}